

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomThreeAction::Look(BlueRoomThreeAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  BlueRoomThreeAction *local_18;
  BlueRoomThreeAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == PIPE) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    local_4d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "The pipes appear to be some complex, interconnected mechanism, each about 3 inches in diameter."
               ,&local_39);
    ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_38);
    local_4d = 0;
    this_local = (BlueRoomThreeAction *)pAVar2;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == BALL) {
      pAVar2 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,
                 "The ball is between 2 to 3 inches in diameter. Looks like it might fit through those pipes."
                 ,&local_71);
      ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_70);
      this_local = (BlueRoomThreeAction *)pAVar2;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      this_local = (BlueRoomThreeAction *)AbstractRoomAction::Look(&this->super_AbstractRoomAction);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * BlueRoomThreeAction::Look() {
    if (commands->getMainItem() == PIPE) {
        return new ActionResults(CURRENT, "The pipes appear to be some complex, interconnected mechanism, each about 3 inches in diameter.");
    } else if(commands->getMainItem() == BALL){
        return new ActionResults(CURRENT, "The ball is between 2 to 3 inches in diameter. Looks like it might fit through those pipes.");
    } else {
        return AbstractRoomAction::Look();
    }
}